

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FramebufferGLImpl.cpp
# Opt level: O1

void __thiscall
Diligent::FramebufferGLImpl::FramebufferGLImpl
          (FramebufferGLImpl *this,IReferenceCounters *pRefCounters,RenderDeviceGLImpl *pDevice,
          FramebufferDesc *Desc,GLContextState *CtxState)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  TextureViewGLImpl *pTVar7;
  GLFrameBufferObj ResolveFBO;
  GLFrameBufferObj RenderTargetFBO;
  TextureViewGLImpl *ppRsvlViews [8];
  TextureViewGLImpl *ppRTVs [8];
  GLFrameBufferObj local_11c;
  FramebufferDesc *local_108;
  GLContextState *local_100;
  vector<Diligent::FramebufferGLImpl::SubpassFramebuffers,std::allocator<Diligent::FramebufferGLImpl::SubpassFramebuffers>>
  *local_f8;
  GLFrameBufferObj local_ec;
  long local_d8;
  GLFrameBufferObj local_cc;
  TextureViewGLImpl *local_b8 [17];
  long lVar3;
  
  local_108 = Desc;
  local_100 = CtxState;
  FramebufferBase<Diligent::EngineGLImplTraits>::FramebufferBase
            (&this->super_FramebufferBase<Diligent::EngineGLImplTraits>,pRefCounters,pDevice,Desc,
             false);
  (this->super_FramebufferBase<Diligent::EngineGLImplTraits>).
  super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
  .super_ObjectBase<Diligent::IFramebuffer>.super_RefCountedObject<Diligent::IFramebuffer>.
  super_IFramebuffer.super_IDeviceObject.super_IObject = (IObject)&PTR_QueryInterface_00b07c90;
  (this->m_SubpassFramebuffers).
  super__Vector_base<Diligent::FramebufferGLImpl::SubpassFramebuffers,_std::allocator<Diligent::FramebufferGLImpl::SubpassFramebuffers>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_SubpassFramebuffers).
  super__Vector_base<Diligent::FramebufferGLImpl::SubpassFramebuffers,_std::allocator<Diligent::FramebufferGLImpl::SubpassFramebuffers>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_SubpassFramebuffers).
  super__Vector_base<Diligent::FramebufferGLImpl::SubpassFramebuffers,_std::allocator<Diligent::FramebufferGLImpl::SubpassFramebuffers>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8 = (vector<Diligent::FramebufferGLImpl::SubpassFramebuffers,std::allocator<Diligent::FramebufferGLImpl::SubpassFramebuffers>>
              *)&this->m_SubpassFramebuffers;
  iVar2 = (*(((this->super_FramebufferBase<Diligent::EngineGLImplTraits>).
              super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
              .m_Desc.pRenderPass)->super_IDeviceObject).super_IObject._vptr_IObject[4])();
  lVar3 = CONCAT44(extraout_var,iVar2);
  std::
  vector<Diligent::FramebufferGLImpl::SubpassFramebuffers,_std::allocator<Diligent::FramebufferGLImpl::SubpassFramebuffers>_>
  ::reserve(&this->m_SubpassFramebuffers,(ulong)*(uint *)(lVar3 + 0x18));
  if (*(int *)(lVar3 + 0x18) != 0) {
    uVar5 = 0;
    local_d8 = lVar3;
    do {
      lVar3 = *(long *)(local_d8 + 0x20) + uVar5 * 0x48;
      local_b8[0xe] = (TextureViewGLImpl *)0x0;
      local_b8[0xf] = (TextureViewGLImpl *)0x0;
      local_b8[0xc] = (TextureViewGLImpl *)0x0;
      local_b8[0xd] = (TextureViewGLImpl *)0x0;
      local_b8[10] = (TextureViewGLImpl *)0x0;
      local_b8[0xb] = (TextureViewGLImpl *)0x0;
      local_b8[8] = (TextureViewGLImpl *)0x0;
      local_b8[9] = (TextureViewGLImpl *)0x0;
      if (*(int *)(lVar3 + 0x10) != 0) {
        uVar6 = 0;
        do {
          uVar4 = (ulong)*(uint *)(*(long *)(lVar3 + 0x18) + uVar6 * 8);
          if (uVar4 != 0xffffffff) {
            pTVar7 = (TextureViewGLImpl *)
                     (this->super_FramebufferBase<Diligent::EngineGLImplTraits>).
                     super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
                     .m_Desc.ppAttachments[uVar4];
            if (pTVar7 != (TextureViewGLImpl *)0x0) {
              CheckDynamicType<Diligent::TextureViewGLImpl,Diligent::ITextureView>
                        ((ITextureView *)pTVar7);
            }
            local_b8[uVar6 + 8] = pTVar7;
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 < *(uint *)(lVar3 + 0x10));
      }
      if ((*(uint **)(lVar3 + 0x28) == (uint *)0x0) ||
         (uVar6 = (ulong)**(uint **)(lVar3 + 0x28), uVar6 == 0xffffffff)) {
        pTVar7 = (TextureViewGLImpl *)0x0;
      }
      else {
        pTVar7 = (TextureViewGLImpl *)
                 (this->super_FramebufferBase<Diligent::EngineGLImplTraits>).
                 super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
                 .m_Desc.ppAttachments[uVar6];
        if (pTVar7 != (TextureViewGLImpl *)0x0) {
          CheckDynamicType<Diligent::TextureViewGLImpl,Diligent::ITextureView>
                    ((ITextureView *)pTVar7);
        }
      }
      bVar1 = UseDefaultFBO(*(Uint32 *)(lVar3 + 0x10),local_b8 + 8,pTVar7);
      if (bVar1) {
        local_cc.super_GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper>.m_uiHandle = 0;
        local_cc.super_GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper>.
        m_CreateReleaseHelper.m_ExternalFBOHandle = 0;
        local_cc.super_GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper>.m_UniqueId.m_ID = 0;
        local_cc.m_NumDrawBuffers = 0xffffffff;
        local_cc.m_DrawBuffersMask = 0;
      }
      else {
        FBOCache::CreateFBO(&local_cc,local_100,*(Uint32 *)(lVar3 + 0x10),local_b8 + 8,pTVar7,
                            local_108->Width,local_108->Height);
      }
      local_11c.super_GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper>.m_uiHandle = 0;
      local_11c.super_GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper>.m_CreateReleaseHelper
      .m_ExternalFBOHandle = 0;
      local_11c.super_GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper>.m_UniqueId.m_ID = 0;
      local_11c.m_NumDrawBuffers = 0xffffffff;
      local_11c.m_DrawBuffersMask = 0;
      if (*(long *)(lVar3 + 0x20) != 0) {
        local_b8[6] = (TextureViewGLImpl *)0x0;
        local_b8[7] = (TextureViewGLImpl *)0x0;
        local_b8[4] = (TextureViewGLImpl *)0x0;
        local_b8[5] = (TextureViewGLImpl *)0x0;
        local_b8[2] = (TextureViewGLImpl *)0x0;
        local_b8[3] = (TextureViewGLImpl *)0x0;
        local_b8[0] = (TextureViewGLImpl *)0x0;
        local_b8[1] = (TextureViewGLImpl *)0x0;
        if (*(int *)(lVar3 + 0x10) != 0) {
          uVar6 = 0;
          do {
            uVar4 = (ulong)*(uint *)(*(long *)(lVar3 + 0x20) + uVar6 * 8);
            if (uVar4 != 0xffffffff) {
              pTVar7 = (TextureViewGLImpl *)
                       (this->super_FramebufferBase<Diligent::EngineGLImplTraits>).
                       super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
                       .m_Desc.ppAttachments[uVar4];
              if (pTVar7 != (TextureViewGLImpl *)0x0) {
                CheckDynamicType<Diligent::TextureViewGLImpl,Diligent::ITextureView>
                          ((ITextureView *)pTVar7);
              }
              local_b8[uVar6] = pTVar7;
            }
            uVar6 = uVar6 + 1;
          } while (uVar6 < *(uint *)(lVar3 + 0x10));
        }
        bVar1 = UseDefaultFBO(*(Uint32 *)(lVar3 + 0x10),local_b8,(TextureViewGLImpl *)0x0);
        if (bVar1) {
          local_ec.super_GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper>.m_uiHandle = 0;
          local_ec.super_GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper>.
          m_CreateReleaseHelper.m_ExternalFBOHandle = 0;
          local_ec.super_GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper>.m_UniqueId.m_ID =
               0;
          local_ec.m_NumDrawBuffers = 0xffffffff;
          local_ec.m_DrawBuffersMask = 0;
        }
        else {
          FBOCache::CreateFBO(&local_ec,local_100,*(Uint32 *)(lVar3 + 0x10),local_b8,
                              (TextureViewGLImpl *)0x0,local_108->Width,local_108->Height);
        }
        GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper>::operator=
                  (&local_11c.super_GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper>,
                   &local_ec.super_GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper>);
        local_11c.m_NumDrawBuffers = local_ec.m_NumDrawBuffers;
        local_11c.m_DrawBuffersMask = local_ec.m_DrawBuffersMask;
        local_ec.m_NumDrawBuffers = 0;
        local_ec.m_DrawBuffersMask = 0;
        GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper>::~GLObjWrapper
                  (&local_ec.super_GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper>);
      }
      GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper>::SetName
                (&local_cc.super_GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper>,
                 (this->super_FramebufferBase<Diligent::EngineGLImplTraits>).
                 super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
                 .m_Desc.super_DeviceObjectAttribs.Name);
      std::
      vector<Diligent::FramebufferGLImpl::SubpassFramebuffers,std::allocator<Diligent::FramebufferGLImpl::SubpassFramebuffers>>
      ::emplace_back<GLObjectWrappers::GLFrameBufferObj,GLObjectWrappers::GLFrameBufferObj>
                (local_f8,&local_cc,&local_11c);
      GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper>::~GLObjWrapper
                (&local_11c.super_GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper>);
      GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper>::~GLObjWrapper
                (&local_cc.super_GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper>);
      uVar5 = uVar5 + 1;
    } while (uVar5 < *(uint *)(local_d8 + 0x18));
  }
  return;
}

Assistant:

FramebufferGLImpl::FramebufferGLImpl(IReferenceCounters*    pRefCounters,
                                     RenderDeviceGLImpl*    pDevice,
                                     const FramebufferDesc& Desc,
                                     GLContextState&        CtxState) :
    TFramebufferBase{pRefCounters, pDevice, Desc}
{
    const auto& RPDesc = m_Desc.pRenderPass->GetDesc();
    m_SubpassFramebuffers.reserve(RPDesc.SubpassCount);
    for (Uint32 subpass = 0; subpass < RPDesc.SubpassCount; ++subpass)
    {
        const auto& SubpassDesc = RPDesc.pSubpasses[subpass];

        TextureViewGLImpl* ppRTVs[MAX_RENDER_TARGETS] = {};
        TextureViewGLImpl* pDSV                       = nullptr;

        for (Uint32 rt = 0; rt < SubpassDesc.RenderTargetAttachmentCount; ++rt)
        {
            const auto& RTAttachmentRef = SubpassDesc.pRenderTargetAttachments[rt];
            if (RTAttachmentRef.AttachmentIndex != ATTACHMENT_UNUSED)
            {
                ppRTVs[rt] = ClassPtrCast<TextureViewGLImpl>(m_Desc.ppAttachments[RTAttachmentRef.AttachmentIndex]);
            }
        }

        if (SubpassDesc.pDepthStencilAttachment != nullptr && SubpassDesc.pDepthStencilAttachment->AttachmentIndex != ATTACHMENT_UNUSED)
        {
            pDSV = ClassPtrCast<TextureViewGLImpl>(m_Desc.ppAttachments[SubpassDesc.pDepthStencilAttachment->AttachmentIndex]);
        }
        auto RenderTargetFBO = UseDefaultFBO(SubpassDesc.RenderTargetAttachmentCount, ppRTVs, pDSV) ?
            GLObjectWrappers::GLFrameBufferObj{false} :
            FBOCache::CreateFBO(CtxState, SubpassDesc.RenderTargetAttachmentCount, ppRTVs, pDSV, Desc.Width, Desc.Height);

        GLObjectWrappers::GLFrameBufferObj ResolveFBO{false};
        if (SubpassDesc.pResolveAttachments != nullptr)
        {
            TextureViewGLImpl* ppRsvlViews[MAX_RENDER_TARGETS] = {};
            for (Uint32 rt = 0; rt < SubpassDesc.RenderTargetAttachmentCount; ++rt)
            {
                const auto& RslvAttachmentRef = SubpassDesc.pResolveAttachments[rt];
                if (RslvAttachmentRef.AttachmentIndex != ATTACHMENT_UNUSED)
                {
                    ppRsvlViews[rt] = ClassPtrCast<TextureViewGLImpl>(m_Desc.ppAttachments[RslvAttachmentRef.AttachmentIndex]);
                }
            }
            ResolveFBO = UseDefaultFBO(SubpassDesc.RenderTargetAttachmentCount, ppRsvlViews, nullptr) ?
                GLObjectWrappers::GLFrameBufferObj{false} :
                FBOCache::CreateFBO(CtxState, SubpassDesc.RenderTargetAttachmentCount, ppRsvlViews, nullptr, Desc.Width, Desc.Height);
        }

        RenderTargetFBO.SetName(m_Desc.Name);

        m_SubpassFramebuffers.emplace_back(std::move(RenderTargetFBO), std::move(ResolveFBO));
    }
}